

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_VRR_Algorithm_Base::AMOrder_AddWithDependencies_
          (OSTEI_VRR_Algorithm_Base *this,QAMList *order,QAM *am)

{
  bool bVar1;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> _Var2;
  size_type sVar3;
  QAMList *in_RDX;
  OSTEI_VRR_Algorithm_Base *in_RSI;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMList *__range1;
  QAMList req;
  QAM *in_stack_fffffffffffffe88;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffffe90;
  QAM *in_stack_fffffffffffffe98;
  value_type *__x;
  undefined6 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> in_stack_fffffffffffffea8;
  allocator *paVar4;
  bool local_149;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_f8;
  undefined1 *local_f0;
  value_type local_e8;
  undefined1 local_b8 [26];
  byte local_9e;
  byte local_9d;
  byte local_8a;
  allocator local_89;
  string local_88 [56];
  QAM *in_stack_ffffffffffffffb0;
  OSTEI_VRR_Algorithm_Base *in_stack_ffffffffffffffb8;
  
  std::vector<QAM,_std::allocator<QAM>_>::begin
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffe88);
  std::vector<QAM,_std::allocator<QAM>_>::end
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffe88);
  _Var2._M_current._6_1_ = in_stack_fffffffffffffea6;
  _Var2._M_current._0_6_ = in_stack_fffffffffffffea0;
  _Var2._M_current._7_1_ = in_stack_fffffffffffffea7;
  _Var2 = std::find<__gnu_cxx::__normal_iterator<QAM*,std::vector<QAM,std::allocator<QAM>>>,QAM>
                    (in_stack_fffffffffffffea8,_Var2,in_stack_fffffffffffffe98);
  std::vector<QAM,_std::allocator<QAM>_>::end
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffe88);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                     in_stack_fffffffffffffe90,
                     (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                     in_stack_fffffffffffffe88);
  if (!bVar1) {
    sVar3 = std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::count
                      ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                       CONCAT17(in_stack_fffffffffffffea7,
                                CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
                       in_stack_fffffffffffffe98);
    local_8a = 0;
    local_9d = 0;
    local_9e = 0;
    local_149 = true;
    if (sVar3 != 0) {
      paVar4 = &local_89;
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string(local_88,"",paVar4);
      local_9d = 1;
      QAM::QAM((QAM *)CONCAT17(in_stack_fffffffffffffea7,
                               CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98,
               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(int)in_stack_fffffffffffffe90,
               (string *)in_stack_fffffffffffffe88);
      local_9e = 1;
      in_stack_fffffffffffffea7 =
           QAM::operator==((QAM *)CONCAT17(in_stack_fffffffffffffea7,
                                           CONCAT16(in_stack_fffffffffffffea6,
                                                    in_stack_fffffffffffffea0)),
                           in_stack_fffffffffffffe98);
      local_149 = (bool)in_stack_fffffffffffffea7;
    }
    if ((local_9e & 1) != 0) {
      QAM::~QAM((QAM *)0x123dbe);
    }
    if ((local_9d & 1) != 0) {
      std::__cxx11::string::~string(local_88);
    }
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    if ((local_149 & 1U) == 0) {
      __x = &local_e8;
      QAM::QAM((QAM *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      GetAMReq(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      QAM::~QAM((QAM *)0x123ed3);
      local_f0 = local_b8;
      local_f8._M_current =
           (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin(in_stack_fffffffffffffe88);
      std::vector<QAM,_std::allocator<QAM>_>::end
                ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffe88);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *
                                )in_stack_fffffffffffffe90,
                                (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *
                                )in_stack_fffffffffffffe88), bVar1) {
        in_stack_fffffffffffffe90 = in_RSI;
        __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator*
                  (&local_f8);
        in_RSI = in_stack_fffffffffffffe90;
        QAM::QAM((QAM *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        AMOrder_AddWithDependencies_(in_RSI,in_RDX,_Var2._M_current);
        QAM::~QAM((QAM *)0x123f75);
        __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
                  (&local_f8);
      }
      std::vector<QAM,_std::allocator<QAM>_>::push_back
                ((vector<QAM,_std::allocator<QAM>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,CONCAT16(local_149,in_stack_fffffffffffffea0)),
                 __x);
      std::vector<QAM,_std::allocator<QAM>_>::~vector
                ((vector<QAM,_std::allocator<QAM>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,CONCAT16(local_149,in_stack_fffffffffffffea0)));
    }
  }
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::AMOrder_AddWithDependencies_(QAMList & order, QAM am) const
{
    // skip if it was already done somewhere
    if(std::find(order.begin(), order.end(), am) != order.end())
        return;

    // skip if it's not done by VRR
    if(allam_.count(am) == 0 || am == QAM{0,0,0,0})
        return;

    // get requirements
    auto req = GetAMReq(am);

    for(const auto & it : req)
        AMOrder_AddWithDependencies_(order, it);

    order.push_back(am);
}